

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgen4.c
# Opt level: O1

void getOptions(int *argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  undefined8 *__src;
  uint uVar7;
  long lVar8;
  int iVar9;
  
  builtin_strncpy(commandLine,"Command: ",10);
  if (0 < *argc) {
    sVar5 = strlen(commandLine);
    lVar8 = 0;
    do {
      pcVar2 = argv[lVar8];
      sVar6 = strlen(pcVar2);
      if (999 < sVar6 + ((long)((sVar5 << 0x20) + 0x100000000) >> 0x20)) break;
      strcat(commandLine,pcVar2);
      sVar6 = strlen(commandLine);
      (commandLine + sVar6)[0] = ' ';
      (commandLine + sVar6)[1] = '\0';
      sVar6 = strlen(argv[lVar8]);
      sVar5 = ((long)(sVar5 << 0x20) >> 0x20) + 1 + sVar6;
      lVar8 = lVar8 + 1;
    } while (lVar8 < *argc);
  }
  initOptions();
  iVar9 = *argc;
  __src = (undefined8 *)malloc((long)iVar9 * 8);
  *__src = *argv;
  uVar7 = 1;
  if (1 < (long)iVar9) {
    iVar9 = 1;
    do {
      pcVar2 = argv[iVar9];
      if (*pcVar2 == '-') {
        iVar3 = checkBooleanOption(pcVar2);
        iVar1 = iVar9 + 1;
        if (iVar3 == 0) {
          iVar3 = *argc;
          if (iVar1 < iVar3) {
            iVar4 = strcmp(*stringOptionTags,argv[iVar9] + 1);
            if (iVar4 == 0) {
              *stringOptions = argv[iVar1];
            }
            else if ((iVar3 <= iVar1) ||
                    (iVar3 = checkIntOption(argv[iVar9],argv[iVar1]), iVar3 == 0))
            goto LAB_00101c31;
            iVar1 = iVar9 + 2;
          }
          else {
LAB_00101c31:
            getOptions_cold_1();
          }
        }
      }
      else {
        lVar8 = (long)(int)uVar7;
        uVar7 = uVar7 + 1;
        __src[lVar8] = pcVar2;
        iVar1 = iVar9 + 1;
      }
      iVar9 = iVar1;
    } while (iVar9 < *argc);
  }
  if (0 < (int)uVar7) {
    memcpy(argv,__src,(ulong)uVar7 << 3);
  }
  *argc = uVar7;
  free(__src);
  if ((booleanOptions[3] == 0) && (booleanOptions[5] == 0)) {
    return;
  }
  printHelp();
  exit(1);
}

Assistant:

void getOptions (int *argc, char * argv[])
{
    char **newArgv;
    int oldp, newp, p, pos;

    strcpy (commandLine, "Command: ");
    pos=strlen(commandLine);
    for (p=0; p<*argc && pos+1+strlen(argv[p])<1000;p++)
    {
        strcat (commandLine, argv[p]);
        strcat (commandLine, " ");
        pos += 1 + strlen (argv[p]);
    }


    initOptions();

    newArgv = (char **) malloc ( (*argc)*sizeof(char *));

    oldp = 0;
    newp = 0;

    newArgv[newp++] = argv[oldp++];

    while (oldp < *argc)
    {
        if (strlen (argv[oldp]) == 0 || argv[oldp][0] != '-')
            newArgv[newp++] = argv[oldp++];
        else
        {
            if (checkBooleanOption (argv[oldp]))
                oldp++;
            else
                if (oldp+1 < *argc && checkStringOption (argv[oldp],argv[oldp+1]))
                    oldp += 2;
            else
                if (oldp+1 < *argc && checkIntOption (argv[oldp],argv[oldp+1]))
                    oldp += 2;
            else
            {
                fprintf (stderr, "Unrecognised option %s\n", argv[oldp]);
                oldp++;
            }
        }

    }

    for (p=0;p<newp;p++)
        argv[p] = newArgv[p];
    *argc = newp;

    free (newArgv);

    if (booleanOptions[HELP] || booleanOptions[HELP_SHORT])
    {
        printHelp();
        exit(1);
    }


}